

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::StringToInt64Map::SerializeWithCachedSizes
          (StringToInt64Map *this,CodedOutputStream *output)

{
  MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  *key;
  undefined1 auVar1 [16];
  bool bVar2;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long> *pMVar3
  ;
  size_type sVar4;
  ulong uVar5;
  MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  **ppMVar6;
  MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  **ppMVar7;
  const_pointer key_00;
  const_pointer pvVar8;
  EntryType *pEVar9;
  MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>
  *pMVar10;
  const_reference pvVar11;
  const_iterator local_c0;
  undefined1 local_a8 [8];
  const_iterator it_1;
  scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>_>
  entry_1;
  size_type i;
  scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>_>
  entry;
  const_iterator local_70;
  undefined1 local_48 [8];
  const_iterator it;
  size_type n;
  scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_*>
  items;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  StringToInt64Map *this_local;
  
  items.array_._4_4_ = 0;
  pMVar3 = map_abi_cxx11_(this);
  bVar2 = google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
          ::empty(pMVar3);
  if (!bVar2) {
    bVar2 = google::protobuf::io::CodedOutputStream::IsSerializationDeterministic(output);
    if (bVar2) {
      pMVar3 = map_abi_cxx11_(this);
      sVar4 = google::protobuf::
              Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
              ::size(pMVar3);
      if (1 < sVar4) {
        pMVar3 = map_abi_cxx11_(this);
        sVar4 = google::protobuf::
                Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
                ::size(pMVar3);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = sVar4;
        uVar5 = SUB168(auVar1 * ZEXT816(8),0);
        if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
          uVar5 = 0xffffffffffffffff;
        }
        ppMVar6 = (MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
                   **)operator_new__(uVar5);
        google::protobuf::internal::
        scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_*>
        ::scoped_array((scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_*>
                        *)&n,ppMVar6);
        it.it_.bucket_index_ = 0;
        pMVar3 = map_abi_cxx11_(this);
        google::protobuf::
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::
        begin((const_iterator *)local_48,pMVar3);
        while( true ) {
          pMVar3 = map_abi_cxx11_(this);
          google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
          ::end(&local_70,pMVar3);
          bVar2 = google::protobuf::operator!=((const_iterator *)local_48,&local_70);
          if (!bVar2) break;
          pvVar11 = google::protobuf::
                    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
                    ::const_iterator::operator*((const_iterator *)local_48);
          ppMVar6 = google::protobuf::internal::
                    scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_*>
                    ::operator[]((scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_*>
                                  *)&n,it.it_.bucket_index_);
          *ppMVar6 = pvVar11;
          google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
          ::const_iterator::operator++((const_iterator *)local_48);
          it.it_.bucket_index_ = it.it_.bucket_index_ + 1;
        }
        ppMVar6 = google::protobuf::internal::
                  scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_*>
                  ::operator[]((scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_*>
                                *)&n,0);
        ppMVar7 = google::protobuf::internal::
                  scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_*>
                  ::operator[]((scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_*>
                                *)&n,it.it_.bucket_index_);
        std::
        sort<google::protobuf::MapPair<std::__cxx11::string,long>const**,google::protobuf::internal::CompareByDerefFirst<google::protobuf::MapPair<std::__cxx11::string,long>const*>>
                  (ppMVar6,ppMVar7);
        google::protobuf::internal::
        scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>_>
        ::scoped_ptr((scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>_>
                      *)&i,(MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>
                            *)0x0);
        for (entry_1.ptr_ = (MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>
                             *)0x0; entry_1.ptr_ < it.it_.bucket_index_;
            entry_1.ptr_ = (MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>
                            *)((long)&((entry_1.ptr_)->
                                      super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>
                                      ).super_MessageLite._vptr_MessageLite + 1)) {
          ppMVar6 = google::protobuf::internal::
                    scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_*>
                    ::operator[]((scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_*>
                                  *)&n,(ptrdiff_t)entry_1.ptr_);
          key = *ppMVar6;
          ppMVar6 = google::protobuf::internal::
                    scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_*>
                    ::operator[]((scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_*>
                                  *)&n,(ptrdiff_t)entry_1.ptr_);
          pEVar9 = google::protobuf::internal::
                   MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>
                   ::NewEntryWrapper(&this->map_,&key->first,&(*ppMVar6)->second);
          google::protobuf::internal::
          scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>_>
          ::reset((scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>_>
                   *)&i,pEVar9);
          pMVar10 = google::protobuf::internal::
                    scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>_>
                    ::operator*((scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>_>
                                 *)&i);
          google::protobuf::internal::WireFormatLite::WriteMessage(1,(MessageLite *)pMVar10,output);
          ppMVar6 = google::protobuf::internal::
                    scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_*>
                    ::operator[]((scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_*>
                                  *)&n,(ptrdiff_t)entry_1.ptr_);
          SerializeWithCachedSizes(google::protobuf::io::CodedOutputStream*)::string_long>_const__
                    (*ppMVar6);
        }
        google::protobuf::internal::
        scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>_>
        ::~scoped_ptr((scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>_>
                       *)&i);
        google::protobuf::internal::
        scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_*>
        ::~scoped_array((scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_*>
                         *)&n);
        return;
      }
    }
    google::protobuf::internal::
    scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>_>
    ::scoped_ptr((scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>_>
                  *)&it_1.it_.bucket_index_,
                 (MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>
                  *)0x0);
    pMVar3 = map_abi_cxx11_(this);
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::
    begin((const_iterator *)local_a8,pMVar3);
    while( true ) {
      pMVar3 = map_abi_cxx11_(this);
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::
      end(&local_c0,pMVar3);
      bVar2 = google::protobuf::operator!=((const_iterator *)local_a8,&local_c0);
      if (!bVar2) break;
      key_00 = google::protobuf::
               Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
               ::const_iterator::operator->((const_iterator *)local_a8);
      pvVar8 = google::protobuf::
               Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
               ::const_iterator::operator->((const_iterator *)local_a8);
      pEVar9 = google::protobuf::internal::
               MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>
               ::NewEntryWrapper(&this->map_,&key_00->first,&pvVar8->second);
      google::protobuf::internal::
      scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>_>
      ::reset((scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>_>
               *)&it_1.it_.bucket_index_,pEVar9);
      pMVar10 = google::protobuf::internal::
                scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>_>
                ::operator*((scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>_>
                             *)&it_1.it_.bucket_index_);
      google::protobuf::internal::WireFormatLite::WriteMessage(1,(MessageLite *)pMVar10,output);
      pvVar11 = google::protobuf::
                Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
                ::const_iterator::operator*((const_iterator *)local_a8);
      SerializeWithCachedSizes(google::protobuf::io::CodedOutputStream*)::string_long>_const__
                (pvVar11);
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::
      const_iterator::operator++((const_iterator *)local_a8);
    }
    google::protobuf::internal::
    scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>_>
    ::~scoped_ptr((scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>_>
                   *)&it_1.it_.bucket_index_);
  }
  return;
}

Assistant:

void StringToInt64Map::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.StringToInt64Map)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // map<string, int64> map = 1;
  if (!this->map().empty()) {
    typedef ::google::protobuf::Map< ::std::string, ::google::protobuf::int64 >::const_pointer
        ConstPtr;
    typedef ConstPtr SortItem;
    typedef ::google::protobuf::internal::CompareByDerefFirst<SortItem> Less;
    struct Utf8Check {
      static void Check(ConstPtr p) {
        ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          p->first.data(), p->first.length(),
          ::google::protobuf::internal::WireFormatLite::SERIALIZE,
          "CoreML.Specification.StringToInt64Map.MapEntry.key");
      }
    };

    if (output->IsSerializationDeterministic() &&
        this->map().size() > 1) {
      ::google::protobuf::scoped_array<SortItem> items(
          new SortItem[this->map().size()]);
      typedef ::google::protobuf::Map< ::std::string, ::google::protobuf::int64 >::size_type size_type;
      size_type n = 0;
      for (::google::protobuf::Map< ::std::string, ::google::protobuf::int64 >::const_iterator
          it = this->map().begin();
          it != this->map().end(); ++it, ++n) {
        items[n] = SortItem(&*it);
      }
      ::std::sort(&items[0], &items[n], Less());
      ::google::protobuf::scoped_ptr<StringToInt64Map_MapEntry> entry;
      for (size_type i = 0; i < n; i++) {
        entry.reset(map_.NewEntryWrapper(
            items[i]->first, items[i]->second));
        ::google::protobuf::internal::WireFormatLite::WriteMessage(
            1, *entry, output);
        Utf8Check::Check(items[i]);
      }
    } else {
      ::google::protobuf::scoped_ptr<StringToInt64Map_MapEntry> entry;
      for (::google::protobuf::Map< ::std::string, ::google::protobuf::int64 >::const_iterator
          it = this->map().begin();
          it != this->map().end(); ++it) {
        entry.reset(map_.NewEntryWrapper(
            it->first, it->second));
        ::google::protobuf::internal::WireFormatLite::WriteMessage(
            1, *entry, output);
        Utf8Check::Check(&*it);
      }
    }
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.StringToInt64Map)
}